

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O1

void __thiscall
TPZNonLinMultGridAnalysis::OneGridAlgorithm(TPZNonLinMultGridAnalysis *this,ostream *out,int nummat)

{
  TPZCompMesh *coarcmesh;
  pointer_____offset_0x68___ *vtt;
  TPZCompMesh *this_00;
  TPZMaterial *mat;
  long lVar1;
  int marcha;
  int iter;
  int levelnumbertorefine;
  string solout;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> finestiff;
  TPZStepSolver<double> finesolver;
  TPZLinearAnalysis finean;
  int local_6f8;
  int local_6f4;
  pointer_____offset_0x68___ *local_6f0;
  TPZNonLinMultGridAnalysis *local_6e8;
  TPZAutoPointer<TPZMatrix<double>_> local_6e0;
  int local_6d4;
  string local_6d0;
  undefined1 local_6b0 [168];
  undefined **local_608;
  void *local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined **local_5e8;
  void *local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined4 local_5c0;
  undefined1 local_5bc;
  TPZStepSolver<double> local_5b8;
  undefined1 local_4b8 [360];
  TPZBaseMatrix *local_350;
  undefined **local_170;
  TPZFMatrix<double> local_160;
  TPZFMatrix<std::complex<double>_> local_d0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n",
             0x53);
  local_6d4 = 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2b10afc,0x38);
  std::istream::operator>>((istream *)&std::cin,&local_6d4);
  coarcmesh = *(this->fMeshes).super_TPZManVector<TPZCompMesh_*,_10>.super_TPZVec<TPZCompMesh_*>.
               fStore;
  local_6e8 = this;
  this_00 = UniformlyRefineMesh(coarcmesh,local_6d4,-1);
  mat = TPZCompMesh::FindMaterial(this_00,nummat);
  this_00->fDimModel = coarcmesh->fDimModel;
  local_4b8._0_8_ = local_4b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,"\n\t\t\t* * * MALHA COMPUTACIONAL FINA * * *\n\n","");
  TPZCompMesh::SetName(this_00,(string *)local_4b8);
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  TPZGeoMesh::ResetReference(this_00->fReference);
  TPZCompMesh::LoadReferences(this_00);
  TPZLinearAnalysis::TPZLinearAnalysis
            ((TPZLinearAnalysis *)local_4b8,this_00,true,(ostream *)&std::cout);
  local_5c8 = 0x194c278;
  local_6b0._0_8_ = 0x194c340;
  local_5c0 = 0;
  local_5bc = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)local_6b0,&PTR_construction_vtable_104__0194bb98,this_00);
  local_6f0 = &PTR_construction_vtable_104__0194bb98;
  local_6b0._0_8_ = 0x194bc70;
  local_5c8 = 0x194bd50;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)(local_6b0 + 0xa0),&PTR_construction_vtable_104__0194bbc0)
  ;
  local_6b0._0_8_ = 0x194b950;
  local_5c8 = 0x194bb18;
  local_6b0._160_8_ = 0x194ba18;
  local_608 = &PTR__TPZVec_0183b5f0;
  local_600 = (void *)0x0;
  uStack_5f8 = 0;
  local_5f0 = 0;
  local_5e8 = &PTR__TPZVec_0183b5f0;
  local_5e0 = (void *)0x0;
  uStack_5d8 = 0;
  local_5d0 = 0;
  TPZAnalysis::SetStructuralMatrix((TPZAnalysis *)local_4b8,(TPZStructMatrix *)local_6b0);
  local_6e0.fRef = (TPZReference *)operator_new(0x10);
  (local_6e0.fRef)->fPointer = (TPZMatrix<double> *)0x0;
  ((local_6e0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  ((local_6e0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(&local_5b8,&local_6e0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_6e0);
  TPZStepSolver<double>::SetDirect(&local_5b8,ELDLt);
  TPZLinearAnalysis::SetSolver((TPZLinearAnalysis *)local_4b8,(TPZSolver *)&local_5b8);
  if (local_350 != (TPZBaseMatrix *)0x0) {
    (*(local_350->super_TPZSavable)._vptr_TPZSavable[0xf])();
  }
  SetDeltaTime(local_6e8,this_00,mat);
  lVar1 = __dynamic_cast(mat,&TPZMaterial::typeinfo,&TPZConservationLaw::typeinfo,0);
  *(undefined8 *)(lVar1 + 0x58) = 0xbff0000000000000;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n",0x45);
  std::istream::operator>>((istream *)&std::cin,&local_6f4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n",0x38
            );
  std::istream::operator>>((istream *)&std::cin,&local_6f8);
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"OneGridAlgorithm.vtk","");
  SmoothingSolution(local_6e8,10.0,local_6f4,mat,(TPZLinearAnalysis *)local_4b8,local_6f8,&local_6d0
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  TPZStepSolver<double>::~TPZStepSolver(&local_5b8);
  local_6b0._0_8_ = 0x194b950;
  local_5c8 = 0x194bb18;
  local_6b0._160_8_ = 0x194ba18;
  local_5e8 = &PTR__TPZVec_0183b5f0;
  if (local_5e0 != (void *)0x0) {
    operator_delete__(local_5e0);
  }
  vtt = local_6f0;
  local_608 = &PTR__TPZVec_0183b5f0;
  if (local_600 != (void *)0x0) {
    operator_delete__(local_600);
  }
  TPZStructMatrix::~TPZStructMatrix((TPZStructMatrix *)local_6b0,vtt);
  local_4b8._0_8_ = &PTR__TPZLinearAnalysis_0198f540;
  local_170 = &PTR__TPZSolutionMatrix_0189efc8;
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_d0);
  TPZFMatrix<double>::~TPZFMatrix(&local_160);
  TPZAnalysis::~TPZAnalysis((TPZAnalysis *)local_4b8,&PTR_PTR_0198f650);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::OneGridAlgorithm(std::ostream &out,int nummat){
	//ALGORITMO SIMPLES A UMA MALHA
	int iter,marcha;
	cout << "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n";
	int levelnumbertorefine = 1;
	cout << "TPZNonLinMultGridAnalysis:: nmero de n�eis a dividir: ";
	cin >> levelnumbertorefine;
	TPZCompMesh *coarcmesh = fMeshes[0];//malha grosseira inicial
	int setdegree = -1;//preserva o grau da malha inicial
	TPZCompMesh *finemesh = UniformlyRefineMesh(coarcmesh,levelnumbertorefine,setdegree);
	TPZMaterial * finemat = finemesh->FindMaterial(nummat);
	int meshdim = coarcmesh->Dimension();
	finemesh->SetDimModel(meshdim);
	finemesh->SetName("\n\t\t\t* * * MALHA COMPUTACIONAL FINA * * *\n\n");
	finemesh->Reference()->ResetReference();
	finemesh->LoadReferences();
	TPZLinearAnalysis finean(finemesh);
	TPZSkylineStructMatrix<STATE> finestiff(finemesh);
	finean.SetStructuralMatrix(finestiff);
	TPZStepSolver<STATE> finesolver;
	finesolver.SetDirect(ELDLt);
	finean.SetSolver(finesolver);
	finean.Solution().Zero();
	SetDeltaTime(finemesh,finemat);//para calcular o passo e estimar o nmero de iterac�s
	TPZConservationLaw *law = dynamic_cast<TPZConservationLaw *>(finemat);
	law->SetTimeStep(-1);//para obter o c�culo antes da primeira soluc�
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n";
	cin >> iter;
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n";
	cin >> marcha;
	REAL sol_tol = 1.e1;//valor m�imo da ||solu�o||
	std::string solout("OneGridAlgorithm.vtk");
//	std::string solout("OneGridAlgorithm.dx");
	SmoothingSolution(sol_tol,iter,finemat,finean,marcha,solout);
}